

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

void update_mon(monster_conflict *mon,chunk *c,_Bool full)

{
  bitflag *flags;
  byte *pbVar1;
  uint32_t *puVar2;
  uint8_t uVar3;
  wchar_t idx;
  uint uVar4;
  int iVar5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  uint uVar12;
  wchar_t wVar13;
  loc grid;
  monster_lore *pmVar14;
  loc lVar15;
  monster *pmVar16;
  player_upkeep *ppVar17;
  square *psVar18;
  uint uVar19;
  ulong uVar20;
  loc path_g [256];
  loc local_838 [257];
  
  if (character_dungeon) {
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
  }
  else {
    grid = (loc)loc(c->width / 2,c->height / 2);
  }
  _Var7 = player_of_has(player,L'\r');
  if (mon == (monster_conflict *)0x0) {
    __assert_fail("mon != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                  ,0x14a,"void update_mon(struct monster *, struct chunk *, _Bool)");
  }
  if ((chunk *)cave != c) {
    return;
  }
  uVar3 = player->themed_level;
  pmVar14 = get_lore(mon->race);
  if (full) {
    lVar15 = monster_target_loc(mon);
    uVar19 = lVar15.y - (mon->grid).y;
    uVar4 = -uVar19;
    if (0 < (int)uVar19) {
      uVar4 = uVar19;
    }
    uVar12 = lVar15.x - (mon->grid).x;
    uVar19 = -uVar12;
    if (0 < (int)uVar12) {
      uVar19 = uVar12;
    }
    iVar5 = (uVar4 >> 1) + uVar19;
    if (uVar19 < uVar4) {
      iVar5 = (uVar19 >> 1) + uVar4;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    mon->cdis = (uint8_t)iVar5;
    if ((mon->noise).grids != (uint16_t **)0x0) {
      make_noise((chunk_conflict *)c,(player *)0x0,(monster *)mon);
    }
    if ((mon->scent).grids != (uint16_t **)0x0) {
      update_scent((chunk_conflict *)c,(player *)0x0,(monster *)mon);
    }
  }
  uVar19 = (player->grid).y - (mon->grid).y;
  uVar4 = -uVar19;
  if (0 < (int)uVar19) {
    uVar4 = uVar19;
  }
  uVar12 = (player->grid).x - (mon->grid).x;
  uVar19 = -uVar12;
  if (0 < (int)uVar12) {
    uVar19 = uVar12;
  }
  wVar13 = (uVar4 >> 1) + uVar19;
  if (uVar19 < uVar4) {
    wVar13 = (uVar19 >> 1) + uVar4;
  }
  idx = (mon->target).midx;
  if ((L'\0' < idx) && (pmVar16 = cave_monster((chunk_conflict *)c,idx), pmVar16 == (monster *)0x0))
  {
    (mon->target).midx = L'\0';
  }
  flags = mon->mflag;
  _Var8 = flag_has_dbg(flags,2,5,"mon->mflag","MFLAG_MARK");
  _Var9 = square_isno_esp((chunk_conflict *)c,mon->grid);
  if ((_Var9) || (_Var9 = square_isno_esp((chunk_conflict *)c,grid), _Var9)) {
    _Var7 = false;
  }
  if ((uint)(z_info->max_sight >> (uVar3 != '\0')) < (uint)wVar13) {
    _Var9 = false;
  }
  else {
    if ((_Var7 == false) || (_Var9 = monster_is_esp_detectable((monster *)mon), !_Var9)) {
      _Var9 = false;
    }
    else {
      _Var9 = square_isview((chunk_conflict *)c,mon->grid);
      _Var8 = true;
    }
    _Var10 = square_isview((chunk_conflict *)c,mon->grid);
    if ((_Var10) && (player->timed[2] == 0)) {
      _Var10 = _Var8;
      if (wVar13 <= (player->state).see_infra) {
        flag_on_dbg(pmVar14->flags,0xc,0x34,"lore->flags","RF_COLD_BLOOD");
        _Var8 = flag_has_dbg(mon->race->flags,0xc,0x34,"mon->race->flags","RF_COLD_BLOOD");
        if (!_Var8) {
          _Var9 = true;
          _Var10 = true;
        }
      }
      _Var11 = square_isseen((chunk_conflict *)c,mon->grid);
      _Var8 = _Var10;
      _Var6 = _Var9;
      if (_Var11) {
        flag_on_dbg(pmVar14->flags,0xc,0x33,"lore->flags","RF_INVISIBLE");
        _Var11 = monster_is_invisible((monster *)mon);
        _Var8 = true;
        _Var6 = true;
        if ((_Var11) &&
           (_Var11 = player_of_has(player,L'\x0e'), _Var8 = _Var10, _Var6 = _Var9, _Var11)) {
          _Var8 = true;
          _Var6 = true;
        }
      }
      _Var9 = _Var6;
      if (((chunk *)cave == c) &&
         (lVar15.x = (player->grid).x, lVar15.y = (player->grid).y,
         wVar13 = project_path(c,local_838,(uint)z_info->max_range,lVar15,mon->grid,L'\0'),
         L'\x01' < wVar13)) {
        uVar20 = 0;
        do {
          _Var10 = square_allowslos((chunk_conflict *)player->cave,local_838[uVar20]);
          if (!_Var10) {
            psVar18 = square((chunk_conflict *)c,local_838[uVar20]);
            flag_off(psVar18->info,3,5);
            square_forget((chunk_conflict *)c,local_838[uVar20]);
            square_light_spot(c,local_838[uVar20]);
          }
          uVar20 = uVar20 + 1;
        } while ((uint)(wVar13 + L'\xffffffff') != uVar20);
      }
    }
  }
  _Var10 = monster_is_mimicking((monster *)mon);
  if ((_Var10) && (_Var10 = ignore_item_ok(player,mon->mimicked_obj), _Var10)) {
    _Var8 = false;
    _Var9 = false;
  }
  if (_Var8 == false) {
    _Var7 = monster_is_visible((monster *)mon);
    if ((_Var7) &&
       ((mon->mimicked_obj == (object *)0x0 ||
        (_Var7 = ignore_item_ok(player,mon->mimicked_obj), _Var7)))) {
      flag_off(flags,2,6);
      square_light_spot(c,mon->grid);
      ppVar17 = player->upkeep;
      if ((monster_conflict *)ppVar17->health_who == mon) {
        pbVar1 = (byte *)((long)&ppVar17->redraw + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      goto LAB_00185d83;
    }
  }
  else {
    if (_Var7 != false) {
      flags_set(pmVar14->flags,0xc,0x35,0x36,0x20,0x1f,0);
    }
    _Var7 = monster_is_visible((monster *)mon);
    if (!_Var7) {
      flag_on_dbg(flags,2,6,"mon->mflag","MFLAG_VISIBLE");
      square_light_spot(c,mon->grid);
      ppVar17 = player->upkeep;
      if ((monster_conflict *)ppVar17->health_who == mon) {
        pbVar1 = (byte *)((long)&ppVar17->redraw + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      if (pmVar14->sights < 0x7fff) {
        pmVar14->sights = pmVar14->sights + 1;
      }
LAB_00185d83:
      pbVar1 = (byte *)((long)&ppVar17->redraw + 2);
      *pbVar1 = *pbVar1 | 0x40;
    }
  }
  _Var7 = monster_is_in_view((monster *)mon);
  if (_Var9 == false) {
    if (!_Var7) {
      return;
    }
    flag_off(flags,2,1);
    if (((player->opts).opt[10] != true) || (_Var7 = monster_is_camouflaged((monster *)mon), _Var7))
    goto LAB_00185e03;
  }
  else {
    if (_Var7) {
      return;
    }
    flag_on_dbg(flags,2,1,"mon->mflag","MFLAG_VIEW");
    if ((player->opts).opt[10] == false) goto LAB_00185e03;
  }
  disturb(player);
LAB_00185e03:
  puVar2 = &player->upkeep->redraw;
  *puVar2 = *puVar2 | 0x400000;
  return;
}

Assistant:

void update_mon(struct monster *mon, struct chunk *c, bool full)
{
	struct monster_lore *lore;

	int d, dy, dx;

	/* If still generating the level, measure distances from the middle */
	struct loc pgrid = character_dungeon ? player->grid :
		loc(c->width / 2, c->height / 2);

	/* Seen at all */
	bool flag = false;

	/* Seen by vision */
	bool easy = false;

	/* ESP permitted */
	bool telepathy_ok = player_of_has(player, OF_TELEPATHY);

	/* Themed level */
	bool themed = player->themed_level ? true : false;

	assert(mon != NULL);

	/* Return if this is not the current level */
	if (c != cave) {
		return;
	}

	lore = get_lore(mon->race);
	
	/* Compute distance, or just use the current one; update any heatmaps */
	if (full) {
		/* Target */
		struct loc target = monster_target_loc(mon);

		/* Distance components */
		dy = ABS(target.y - mon->grid.y);
		dx = ABS(target.x - mon->grid.x);

		/* Approximate distance */
		d = (dy > dx) ? (dy + (dx >>  1)) : (dx + (dy >> 1));

		/* Restrict distance */
		if (d > 255) d = 255;

		/* Save the distance */
		mon->cdis = d;

		/* Heatmaps */
		if (mon->noise.grids) {
			make_noise(c, NULL, mon);
		}
		if (mon->scent.grids) {
			update_scent(c, NULL, mon);
		}
	}

	/* Get the actual distance from the player (mon->cdis is now
	 * the distance from the monster to its target) */
	dy = ABS(player->grid.y - mon->grid.y);
	dx = ABS(player->grid.x - mon->grid.x);
	d = (dy > dx) ? (dy + (dx >>  1)) : (dx + (dy >> 1));

	/* Remove any dead monster targets (then what happens? - NRM)*/
	if ((mon->target.midx > 0) && !cave_monster(c, mon->target.midx)) {
		mon->target.midx = 0;
	}

	/* Detected */
	if (mflag_has(mon->mflag, MFLAG_MARK)) flag = true;

	/* Check if telepathy works here */
	if (square_isno_esp(c, mon->grid) || square_isno_esp(c, pgrid)) {
		telepathy_ok = false;
	}

	/* Nearby */
	if (d <= (themed ? z_info->max_sight / 2 : z_info->max_sight)) {
		/* Basic telepathy */
		if (telepathy_ok && monster_is_esp_detectable(mon)) {
			/* Detectable */
			flag = true;

			/* Check for LOS so that MFLAG_VIEW is set later */
			if (square_isview(c, mon->grid)) easy = true;
		}

		/* Normal line of sight and player is not blind */
		if (square_isview(c, mon->grid) && !player->timed[TMD_BLIND]) {
			/* Use "infravision" */
			if (d <= player->state.see_infra) {
				/* Learn about warm/cold blood */
				rf_on(lore->flags, RF_COLD_BLOOD);

				/* Handle "warm blooded" monsters */
				if (!rf_has(mon->race->flags, RF_COLD_BLOOD)) {
					/* Easy to see */
					easy = flag = true;
				}
			}

			/* Use illumination */
			if (square_isseen(c, mon->grid)) {
				/* Learn about invisibility */
				rf_on(lore->flags, RF_INVISIBLE);

				/* Handle invisibility */
				if (monster_is_invisible(mon)) {
					/* See invisible */
					if (player_of_has(player, OF_SEE_INVIS)) {
						/* Easy to see */
						easy = flag = true;
					}
				} else {
					/* Easy to see */
					easy = flag = true;
				}
			}

			/* Learn about intervening squares */
			path_analyse(c, mon->grid);
		}
	}

	/* If a mimic looks like an ignored item, it's not seen */
	if (monster_is_mimicking(mon)) {
		struct object *obj = mon->mimicked_obj;
		if (ignore_item_ok(player, obj))
			easy = flag = false;
	}

	/* Is the monster is now visible? */
	if (flag) {
		/* Learn about the monster's mind */
		if (telepathy_ok) {
			flags_set(lore->flags, RF_SIZE, RF_EMPTY_MIND, RF_WEIRD_MIND,
					  RF_SMART, RF_STUPID, FLAG_END);
		}

		/* It was previously unseen */
		if (!monster_is_visible(mon)) {
			/* Mark as visible */
			mflag_on(mon->mflag, MFLAG_VISIBLE);

			/* Draw the monster */
			square_light_spot(c, mon->grid);

			/* Update health bar as needed */
			if (player->upkeep->health_who == mon)
				player->upkeep->redraw |= (PR_HEALTH);

			/* Hack -- Count "fresh" sightings */
			if (lore->sights < SHRT_MAX)
				lore->sights++;

			/* Window stuff */
			player->upkeep->redraw |= PR_MONLIST;
		}
	} else if (monster_is_visible(mon)) {
		/* Not visible but was previously seen - treat mimics differently */
		if (!mon->mimicked_obj
				|| ignore_item_ok(player, mon->mimicked_obj)) {
			/* Mark as not visible */
			mflag_off(mon->mflag, MFLAG_VISIBLE);

			/* Erase the monster */
			square_light_spot(c, mon->grid);

			/* Update health bar as needed */
			if (player->upkeep->health_who == mon)
				player->upkeep->redraw |= (PR_HEALTH);

			/* Window stuff */
			player->upkeep->redraw |= PR_MONLIST;
		}
	}


	/* Is the monster is now easily visible? */
	if (easy) {
		/* Change */
		if (!monster_is_in_view(mon)) {
			/* Mark as easily visible */
			mflag_on(mon->mflag, MFLAG_VIEW);

			/* Disturb on appearance */
			if (OPT(player, disturb_near))
				disturb(player);

			/* Re-draw monster window */
			player->upkeep->redraw |= PR_MONLIST;
		}
	} else {
		/* Change */
		if (monster_is_in_view(mon)) {
			/* Mark as not easily visible */
			mflag_off(mon->mflag, MFLAG_VIEW);

			/* Disturb on disappearance */
			if (OPT(player, disturb_near) && !monster_is_camouflaged(mon))
				disturb(player);

			/* Re-draw monster list window */
			player->upkeep->redraw |= PR_MONLIST;
		}
	}
}